

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fonts.h
# Opt level: O1

void __thiscall
dlib::font::
draw_string<unsigned_int,std::char_traits<unsigned_int>,std::allocator<unsigned_int>,dlib::rgb_pixel>
          (font *this,canvas *c,rectangle *rect,
          basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
          *str,rgb_pixel *color,size_type first,size_type last,rectangle area_)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  ushort uVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  uchar *puVar9;
  unsigned_long uVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  long *plVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long local_88;
  undefined4 extraout_var_10;
  
  lVar6 = rect->t;
  lVar19 = (c->super_rectangle).l;
  if (lVar19 < rect->l) {
    lVar19 = rect->l;
  }
  lVar18 = (c->super_rectangle).t;
  if (lVar18 < lVar6) {
    lVar18 = lVar6;
  }
  lVar22 = (c->super_rectangle).r;
  lVar17 = rect->r;
  if (lVar22 < rect->r) {
    lVar17 = lVar22;
  }
  lVar22 = (c->super_rectangle).b;
  lVar15 = rect->b;
  if (lVar22 < rect->b) {
    lVar15 = lVar22;
  }
  if (lVar19 <= area_.l) {
    lVar19 = area_.l;
  }
  if (lVar18 <= area_.t) {
    lVar18 = area_.t;
  }
  if (area_.r < lVar17) {
    lVar17 = area_.r;
  }
  if (area_.b < lVar15) {
    lVar15 = area_.b;
  }
  if (((lVar18 <= lVar15) && (lVar19 <= lVar17)) && (str->_M_string_length != 0)) {
    uVar20 = str->_M_string_length - 1;
    if (last != 0xffffffffffffffff) {
      uVar20 = last;
    }
    iVar12 = (*this->_vptr_font[5])(this);
    lVar22 = rect->l;
    iVar13 = (*this->_vptr_font[6])(this);
    if (first <= uVar20) {
      lVar22 = CONCAT44(extraout_var_00,iVar13) + lVar22;
      local_88 = CONCAT44(extraout_var,iVar12) + lVar6 + -1;
      do {
        uVar5 = (str->_M_dataplus)._M_p[first];
        if (uVar5 != 0xd) {
          bVar11 = is_combining_char<unsigned_int>(uVar5);
          if ((bVar11) &&
             (lVar6 = rect->l, iVar12 = (*this->_vptr_font[6])(this),
             CONCAT44(extraout_var_01,iVar12) + lVar6 < lVar22)) {
            iVar12 = (*this->_vptr_font[3])(this,(ulong)(str->_M_dataplus)._M_p[first]);
            lVar22 = lVar22 - (ulong)*(ushort *)(CONCAT44(extraout_var_02,iVar12) + 8);
          }
          uVar5 = (str->_M_dataplus)._M_p[first];
          iVar12 = (*this->_vptr_font[4])(this);
          if (uVar5 == 10) {
            local_88 = local_88 + CONCAT44(extraout_var_03,iVar12);
            lVar22 = rect->l;
            iVar12 = (*this->_vptr_font[6])(this);
            lVar22 = CONCAT44(extraout_var_04,iVar12) + lVar22;
          }
          else {
            if (CONCAT44(extraout_var_03,iVar12) + lVar15 < local_88) {
              return;
            }
            iVar12 = (*this->_vptr_font[6])(this);
            if (lVar22 - CONCAT44(extraout_var_05,iVar12) < lVar19) {
              iVar12 = (*this->_vptr_font[3])(this,(ulong)(str->_M_dataplus)._M_p[first]);
              uVar4 = *(ushort *)(CONCAT44(extraout_var_06,iVar12) + 8);
              iVar12 = (*this->_vptr_font[7])(this);
              if ((long)(CONCAT44(extraout_var_07,iVar12) + lVar22 + (ulong)uVar4) < lVar19) {
                iVar12 = (*this->_vptr_font[3])(this,(ulong)(str->_M_dataplus)._M_p[first]);
                lVar22 = lVar22 + (ulong)*(ushort *)(CONCAT44(extraout_var_08,iVar12) + 8);
                goto LAB_002853dd;
              }
            }
            iVar12 = (*this->_vptr_font[7])(this);
            if (lVar22 <= CONCAT44(extraout_var_09,iVar12) + lVar17) {
              iVar12 = (*this->_vptr_font[3])(this,(ulong)(str->_M_dataplus)._M_p[first]);
              plVar14 = (long *)CONCAT44(extraout_var_10,iVar12);
              uVar4 = *(ushort *)((long)plVar14 + 10);
              if ((ulong)uVar4 != 0) {
                lVar6 = *plVar14;
                lVar7 = (c->super_rectangle).l;
                lVar8 = (c->super_rectangle).t;
                puVar9 = c->bits;
                uVar10 = c->row_width;
                uVar1 = color->red;
                uVar2 = color->green;
                uVar3 = color->blue;
                uVar23 = 0;
                do {
                  lVar21 = *(char *)(lVar6 + uVar23 * 2) + lVar22;
                  if (((lVar19 <= lVar21) && (lVar21 <= lVar17)) &&
                     ((lVar16 = *(char *)(lVar6 + 1 + uVar23 * 2) + local_88, lVar18 <= lVar16 &&
                      (lVar16 <= lVar15)))) {
                    lVar16 = (lVar16 - lVar8) * uVar10;
                    lVar21 = lVar21 - lVar7;
                    puVar9[lVar21 * 4 + lVar16 + 2] = uVar1;
                    puVar9[lVar21 * 4 + lVar16 + 1] = uVar2;
                    puVar9[lVar21 * 4 + lVar16] = uVar3;
                  }
                  uVar23 = uVar23 + 1;
                } while (uVar4 != uVar23);
              }
              lVar22 = lVar22 + (ulong)*(ushort *)(plVar14 + 1);
            }
          }
        }
LAB_002853dd:
        first = first + 1;
      } while (first <= uVar20);
    }
  }
  return;
}

Assistant:

void draw_string (
            const canvas& c,
            const rectangle& rect,
            const std::basic_string<T,traits,alloc>& str,
            const pixel_type& color,
            typename std::basic_string<T,traits,alloc>::size_type first = 0,
            typename std::basic_string<T,traits,alloc>::size_type last = (std::basic_string<T,traits,alloc>::npos),
            const rectangle area_ = rectangle(std::numeric_limits<long>::min(), std::numeric_limits<long>::min(),
                                            std::numeric_limits<long>::max(), std::numeric_limits<long>::max())
        ) const
        {
            typedef std::basic_string<T,traits,alloc> string;
            DLIB_ASSERT ( (last == string::npos) || (first <= last && last < str.size())  ,
                          "\tvoid font::draw_string()"
                          << "\n\tlast == string::npos: " << ((last == string::npos)?"true":"false") 
                          << "\n\tfirst: " << (unsigned long)first 
                          << "\n\tlast:  " << (unsigned long)last 
                          << "\n\tstr.size():  " << (unsigned long)str.size() );

            rectangle area = rect.intersect(c).intersect(area_);
            if (area.is_empty() || str.size() == 0)
                return;

            if (last == string::npos)
                last = str.size()-1;

            const font& f = *this;        

            long y_offset = rect.top() + f.ascender() - 1;

            long pos = rect.left()+f.left_overflow();
            for (typename string::size_type i = first; i <= last; ++i)
            {
                // ignore the '\r' character
                if (str[i] == '\r')
                    continue;

                // A combining character should be applied to the previous character, and we
                // therefore make one step back. If a combining comes right after a newline, 
                // then there must be some kind of error in the string, and we don't combine.
                if(is_combining_char(str[i]) && 
                   pos > rect.left() + static_cast<long>(f.left_overflow()))
                {
                    pos -= f[str[i]].width();
                }

                if (str[i] == '\n')
                {
                    y_offset += f.height();
                    pos = rect.left()+f.left_overflow();
                    continue;
                }

                // only look at letters in the intersection area
                if (area.bottom() + static_cast<long>(f.height()) < y_offset)
                {
                    // the string is now below our rectangle so we are done
                    break;
                }
                else if (area.left() > pos - static_cast<long>(f.left_overflow()) && 
                    pos + static_cast<long>(f[str[i]].width() + f.right_overflow()) < area.left() )
                {
                    pos += f[str[i]].width();                
                    continue;
                }
                else if (area.right() + static_cast<long>(f.right_overflow()) < pos)
                {
                    // keep looking because there might be a '\n' in the string that
                    // will wrap us around and put us back into our rectangle.
                    continue;
                }

                // at this point in the loop we know that f[str[i]] overlaps 
                // horizontally with the intersection rectangle area.

                const letter& l = f[str[i]];
                for (unsigned short i = 0; i < l.num_of_points(); ++i)
                {
                    const long x = l[i].x + pos;
                    const long y = l[i].y + y_offset;
                    // draw each pixel of the letter if it is inside the intersection
                    // rectangle
                    if (area.contains(x,y))
                    {
                        assign_pixel(c[y-c.top()][x-c.left()], color);
                    }
                }

                pos += l.width();
            }
        }